

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O3

void __thiscall ScapeGoatTree::caseA(ScapeGoatTree *this,Node *par,Node *loc)

{
  if ((par != (Node *)0x0) && (this = (ScapeGoatTree *)&par->leftChild, par->leftChild != loc)) {
    this = (ScapeGoatTree *)par;
  }
  ((Node *)this)->rightChild = (Node *)0x0;
  return;
}

Assistant:

void ScapeGoatTree::caseA(Node *par, Node *loc) {
    if (par == nullptr) {
        root = nullptr;
    } else {
        if (loc == par->leftChild) {
            par->leftChild = nullptr;
        } else {
            par->rightChild = nullptr;
        }
    }
}